

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O2

bool __thiscall SubfloatFlow::traceForward(SubfloatFlow *this,ReplaceVarnode *rvn)

{
  OpCode opc;
  _List_node_base *p_Var1;
  PcodeOp *this_00;
  Varnode *vn;
  bool bVar2;
  int4 slot;
  ReplaceOp *rop;
  ReplaceVarnode *in2;
  _Self __tmp;
  ReplaceVarnode *in1;
  _List_node_base *p_Var3;
  bool inworklist;
  SubfloatFlow *local_58;
  ReplaceVarnode *local_50;
  _List_node_base *local_48;
  ReplaceVarnode *rvn2;
  vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_> *local_38;
  
  local_48 = (_List_node_base *)&rvn->vn->descend;
  local_38 = &this->worklist;
  p_Var1 = (rvn->vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  local_58 = this;
  local_50 = rvn;
LAB_002f8421:
  while (p_Var3 = p_Var1, p_Var3 != local_48) {
    p_Var1 = p_Var3->_M_next;
    this_00 = (PcodeOp *)p_Var3[1]._M_next;
    vn = this_00->output;
    if ((vn == (Varnode *)0x0) || ((vn->flags & 1) == 0)) {
      slot = PcodeOp::getSlot(this_00,local_50->vn);
      opc = this_00->opcode->opcode;
      switch(opc) {
      case CPUI_FLOAT_EQUAL:
      case CPUI_FLOAT_NOTEQUAL:
      case CPUI_FLOAT_LESS:
      case CPUI_FLOAT_LESSEQUAL:
        rvn2 = setReplacement(local_58,(this_00->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start[1 - slot],
                              &inworklist);
        if (rvn2 == (ReplaceVarnode *)0x0) goto switchD_002f847a_caseD_2d;
        if (inworklist == true) {
          std::
          vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>::
          push_back(local_38,&rvn2);
        }
        in2 = rvn2;
        in1 = local_50;
        if (slot != 0) {
          in2 = local_50;
          in1 = rvn2;
        }
        addtocomplist(local_58,in1,in2,this_00);
        break;
      case CPUI_FLOAT_LESSEQUAL|CPUI_COPY:
      case CPUI_FLOAT_INT2FLOAT:
        goto switchD_002f847a_caseD_2d;
      case CPUI_FLOAT_ADD:
      case CPUI_FLOAT_DIV:
      case CPUI_FLOAT_MULT:
      case CPUI_FLOAT_SUB:
      case CPUI_FLOAT_NEG:
      case CPUI_FLOAT_ABS:
      case CPUI_FLOAT_SQRT:
      case CPUI_FLOAT_CEIL:
      case CPUI_FLOAT_FLOOR:
      case CPUI_FLOAT_ROUND:
      case CPUI_MULTIEQUAL:
        goto switchD_002f847a_caseD_2f;
      case CPUI_FLOAT_FLOAT2FLOAT:
        if (vn->size < local_58->precision) goto switchD_002f847a_caseD_2d;
      case CPUI_FLOAT_NAN:
      case CPUI_FLOAT_TRUNC:
        addtopulllist(local_58,this_00,local_50);
        break;
      default:
        if (opc == CPUI_COPY) goto switchD_002f847a_caseD_2f;
        goto switchD_002f847a_caseD_2d;
      }
    }
  }
  goto switchD_002f847a_caseD_2d;
switchD_002f847a_caseD_2f:
  rop = createOpDown(this,opc,(int4)((ulong)((long)(this_00->inrefs).
                                                                                                      
                                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this_00->inrefs).
                                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                     this_00,local_50,slot);
  bVar2 = createLink(this,rop,-1,vn);
  if (!bVar2) {
switchD_002f847a_caseD_2d:
    return p_Var3 == local_48;
  }
  goto LAB_002f8421;
}

Assistant:

bool SubfloatFlow::traceForward(ReplaceVarnode *rvn)

{ // Try to trace logical variable through descendant varnodes
  // updating list/map of replace_ops and replace_varnodes
  // and the worklist
  ReplaceVarnode *rvn2;
  ReplaceOp *rop;
  PcodeOp *op;
  Varnode *outvn;
  int4 slot;
  bool inworklist;
  int4 dcount = 0;
  int4 hcount = 0;

  list<PcodeOp *>::const_iterator iter,enditer;
  iter = rvn->vn->beginDescend();
  enditer = rvn->vn->endDescend();
  while(iter != enditer) {
    op = *iter++;
    outvn = op->getOut();
    if ((outvn!=(Varnode *)0)&&(outvn->isMark()))
      continue;
    dcount += 1;		// Count this descendant
    slot = op->getSlot(rvn->vn);
    switch(op->code()) {
    case CPUI_COPY:
    case CPUI_FLOAT_CEIL:
    case CPUI_FLOAT_FLOOR:
    case CPUI_FLOAT_ROUND:
    case CPUI_FLOAT_NEG:
    case CPUI_FLOAT_ABS:
    case CPUI_FLOAT_SQRT:
    case CPUI_FLOAT_ADD:
    case CPUI_FLOAT_SUB:
    case CPUI_FLOAT_MULT:
    case CPUI_FLOAT_DIV:
    case CPUI_MULTIEQUAL:
      rop = createOpDown(op->code(),op->numInput(),op,rvn,slot);
      if (!createLink(rop,-1,outvn)) return false;
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_FLOAT2FLOAT:
      if (outvn->getSize() < precision)
	return false;
      addtopulllist(op,rvn);
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_EQUAL:
    case CPUI_FLOAT_NOTEQUAL:
    case CPUI_FLOAT_LESS:
    case CPUI_FLOAT_LESSEQUAL:
      rvn2 = setReplacement(op->getIn(1-slot),inworklist);
      if (rvn2 == (ReplaceVarnode *)0) return false;
      if (inworklist)
	worklist.push_back(rvn2);
      if (slot == 0)
	addtocomplist(rvn,rvn2,op);
      else
	addtocomplist(rvn2,rvn,op);
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_TRUNC:
    case CPUI_FLOAT_NAN:
      addtopulllist(op,rvn);
      hcount += 1;
      break;
    default:
      return false;
    }
  }
  if (dcount != hcount) {
    // Must account for all descendants of an input
    if (rvn->vn->isInput()) return false;
  }
  return true;
}